

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMeshSolution.cpp
# Opt level: O3

void __thiscall TPZMeshSolution::Print(TPZMeshSolution *this,ostream *out)

{
  int iVar1;
  long *plVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"virtual void TPZMeshSolution::Print(std::ostream &)",0x33);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"NFunctions = ",0xd);
  iVar1 = (**(code **)((long)this->super_TPZFunction<double> + 0x70))(this);
  plVar2 = (long *)std::ostream::operator<<(out,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Polynomial Order = ",0x13);
  iVar1 = (**(code **)((long)this->super_TPZFunction<double> + 0x68))(this);
  plVar2 = (long *)std::ostream::operator<<(out,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return;
}

Assistant:

void TPZMeshSolution::Print(std::ostream &out)
{
    out << __PRETTY_FUNCTION__ << std::endl;
    out << "NFunctions = " << NFunctions() << std::endl;
    out << "Polynomial Order = " << PolynomialOrder() << std::endl;
}